

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O3

void __thiscall UnitTest_string1::Run(UnitTest_string1 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  String str2;
  String str1;
  string local_d8;
  string local_b8;
  String local_98;
  String local_60;
  
  luna::String::String(&local_60,"abc");
  luna::String::String(&local_98,"abc");
  bVar4 = luna::operator==(&local_60,&local_98);
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 == str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_98,&local_60);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 <= str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_60,&local_98);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 >= str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (local_60.hash_ != local_98.hash_) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetHash() == str2.GetHash()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (local_60.length_ != local_98.length_) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetLength() == str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d8,&local_60);
  luna::String::GetStdString_abi_cxx11_(&local_b8,&local_98);
  _Var3._M_p = local_b8._M_dataplus._M_p;
  if (local_d8._M_string_length == local_b8._M_string_length) {
    if (local_d8._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      iVar5 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_d8._M_string_length);
      bVar4 = iVar5 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
  }
  paVar2 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetStdString() == str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::SetValue(&local_60,"abcdefghijklmn");
  luna::String::SetValue(&local_98,"abcdefghijklmnopqrst");
  bVar4 = luna::operator==(&local_60,&local_98);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 != str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_60,&local_98);
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 < str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_60,&local_98);
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str2 > str1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (local_98.length_ <= local_60.length_) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetLength() < str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d8,&local_60);
  luna::String::GetStdString_abi_cxx11_(&local_b8,&local_98);
  _Var3._M_p = local_b8._M_dataplus._M_p;
  if (local_d8._M_string_length == local_b8._M_string_length) {
    if (local_d8._M_string_length == 0) {
      bVar4 = false;
    }
    else {
      iVar5 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_d8._M_string_length);
      bVar4 = iVar5 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetStdString() != str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::SetValue(&local_60,"abc");
  luna::String::SetValue(&local_98,"def");
  bVar4 = luna::operator==(&local_60,&local_98);
  if (bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 != str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_60,&local_98);
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str1 < str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  bVar4 = luna::operator<(&local_60,&local_98);
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\'str2 > str1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  if (local_60.length_ != local_98.length_) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetLength() == str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d8,&local_60);
  luna::String::GetStdString_abi_cxx11_(&local_b8,&local_98);
  if (local_d8._M_string_length == local_b8._M_string_length) {
    if (local_d8._M_string_length == 0) {
      bVar4 = false;
    }
    else {
      iVar5 = bcmp(local_d8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_d8._M_string_length);
      bVar4 = iVar5 != 0;
    }
  }
  else {
    bVar4 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (!bVar4) {
    local_d8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"\'str1.GetStdString() != str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
  }
  luna::String::~String(&local_98);
  luna::String::~String(&local_60);
  return;
}

Assistant:

TEST_CASE(string1)
{
    luna::String str1("abc");
    luna::String str2("abc");

    EXPECT_TRUE(str1 == str2);
    EXPECT_TRUE(str1 <= str2);
    EXPECT_TRUE(str1 >= str2);
    EXPECT_TRUE(str1.GetHash() == str2.GetHash());
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() == str2.GetStdString());

    str1.SetValue("abcdefghijklmn");
    str2.SetValue("abcdefghijklmnopqrst");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() < str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());

    str1.SetValue("abc");
    str2.SetValue("def");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());
}